

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

cmpresult_t uECC_vli_cmp_unsafe(uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  char local_22;
  wordcount_t i;
  wordcount_t num_words_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  
  local_22 = num_words + -1;
  while( true ) {
    if (local_22 < '\0') {
      return '\0';
    }
    if (right[local_22] < left[local_22]) break;
    if (left[local_22] < right[local_22]) {
      return -1;
    }
    local_22 = local_22 + -1;
  }
  return '\x01';
}

Assistant:

static cmpresult_t uECC_vli_cmp_unsafe(const uECC_word_t *left,
                                       const uECC_word_t *right,
                                       wordcount_t num_words) {
    wordcount_t i;
    for (i = num_words - 1; i >= 0; --i) {
        if (left[i] > right[i]) {
            return 1;
        } else if (left[i] < right[i]) {
            return -1;
        }
    }
    return 0;
}